

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  bool bVar26;
  char cVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  undefined4 uVar31;
  ulong unaff_RBX;
  ulong uVar32;
  ulong uVar33;
  NodeRef *pNVar34;
  NodeRef *pNVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar47;
  undefined1 auVar43 [32];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  undefined1 auVar49 [32];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar56 [32];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar66 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar79;
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 in_ZMM10 [64];
  float fVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 in_ZMM11 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  NodeRef stack [564];
  undefined1 auVar62 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar99._4_4_ = fVar1;
  auVar99._0_4_ = fVar1;
  auVar99._8_4_ = fVar1;
  auVar99._12_4_ = fVar1;
  auVar99._16_4_ = fVar1;
  auVar99._20_4_ = fVar1;
  auVar99._24_4_ = fVar1;
  auVar99._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar64._4_4_ = fVar2;
  auVar64._0_4_ = fVar2;
  auVar64._8_4_ = fVar2;
  auVar64._12_4_ = fVar2;
  auVar64._16_4_ = fVar2;
  auVar64._20_4_ = fVar2;
  auVar64._24_4_ = fVar2;
  auVar64._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar97._4_4_ = fVar3;
  auVar97._0_4_ = fVar3;
  auVar97._8_4_ = fVar3;
  auVar97._12_4_ = fVar3;
  auVar97._16_4_ = fVar3;
  auVar97._20_4_ = fVar3;
  auVar97._24_4_ = fVar3;
  auVar97._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  fVar10 = *(float *)((long)&(tray->tnear).field_0 + k * 4);
  auVar68._4_4_ = fVar10;
  auVar68._0_4_ = fVar10;
  auVar68._8_4_ = fVar10;
  auVar68._12_4_ = fVar10;
  auVar68._16_4_ = fVar10;
  auVar68._20_4_ = fVar10;
  auVar68._24_4_ = fVar10;
  auVar68._28_4_ = fVar10;
  fVar11 = *(float *)((long)&(tray->tfar).field_0 + k * 4);
  auVar71._4_4_ = fVar11;
  auVar71._0_4_ = fVar11;
  auVar71._8_4_ = fVar11;
  auVar71._12_4_ = fVar11;
  auVar71._16_4_ = fVar11;
  auVar71._20_4_ = fVar11;
  auVar71._24_4_ = fVar11;
  auVar71._28_4_ = fVar11;
  pNVar35 = stack + 1;
  do {
    pNVar34 = pNVar35;
    if (pNVar34 == stack) break;
    pNVar35 = pNVar34 + -1;
    sVar37 = pNVar34[-1].ptr;
    do {
      if ((sVar37 & 0xf) == 0) {
        auVar89 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + uVar38),auVar99);
        auVar16._4_4_ = fVar7 * auVar89._4_4_;
        auVar16._0_4_ = fVar7 * auVar89._0_4_;
        auVar16._8_4_ = fVar7 * auVar89._8_4_;
        auVar16._12_4_ = fVar7 * auVar89._12_4_;
        auVar16._16_4_ = fVar7 * auVar89._16_4_;
        auVar16._20_4_ = fVar7 * auVar89._20_4_;
        auVar16._24_4_ = fVar7 * auVar89._24_4_;
        auVar16._28_4_ = auVar89._28_4_;
        auVar89 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + uVar39),auVar64);
        auVar17._4_4_ = fVar8 * auVar89._4_4_;
        auVar17._0_4_ = fVar8 * auVar89._0_4_;
        auVar17._8_4_ = fVar8 * auVar89._8_4_;
        auVar17._12_4_ = fVar8 * auVar89._12_4_;
        auVar17._16_4_ = fVar8 * auVar89._16_4_;
        auVar17._20_4_ = fVar8 * auVar89._20_4_;
        auVar17._24_4_ = fVar8 * auVar89._24_4_;
        auVar17._28_4_ = auVar89._28_4_;
        auVar89 = vmaxps_avx(auVar16,auVar17);
        auVar43 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + uVar32),auVar97);
        auVar18._4_4_ = fVar9 * auVar43._4_4_;
        auVar18._0_4_ = fVar9 * auVar43._0_4_;
        auVar18._8_4_ = fVar9 * auVar43._8_4_;
        auVar18._12_4_ = fVar9 * auVar43._12_4_;
        auVar18._16_4_ = fVar9 * auVar43._16_4_;
        auVar18._20_4_ = fVar9 * auVar43._20_4_;
        auVar18._24_4_ = fVar9 * auVar43._24_4_;
        auVar18._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + (uVar38 ^ 0x20)),auVar99);
        auVar19._4_4_ = fVar7 * auVar43._4_4_;
        auVar19._0_4_ = fVar7 * auVar43._0_4_;
        auVar19._8_4_ = fVar7 * auVar43._8_4_;
        auVar19._12_4_ = fVar7 * auVar43._12_4_;
        auVar19._16_4_ = fVar7 * auVar43._16_4_;
        auVar19._20_4_ = fVar7 * auVar43._20_4_;
        auVar19._24_4_ = fVar7 * auVar43._24_4_;
        auVar19._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + (uVar39 ^ 0x20)),auVar64);
        auVar20._4_4_ = fVar8 * auVar43._4_4_;
        auVar20._0_4_ = fVar8 * auVar43._0_4_;
        auVar20._8_4_ = fVar8 * auVar43._8_4_;
        auVar20._12_4_ = fVar8 * auVar43._12_4_;
        auVar20._16_4_ = fVar8 * auVar43._16_4_;
        auVar20._20_4_ = fVar8 * auVar43._20_4_;
        auVar20._24_4_ = fVar8 * auVar43._24_4_;
        auVar20._28_4_ = auVar43._28_4_;
        auVar49 = vminps_avx(auVar19,auVar20);
        auVar43 = vsubps_avx(*(undefined1 (*) [32])(sVar37 + 0x40 + (uVar32 ^ 0x20)),auVar97);
        auVar21._4_4_ = fVar9 * auVar43._4_4_;
        auVar21._0_4_ = fVar9 * auVar43._0_4_;
        auVar21._8_4_ = fVar9 * auVar43._8_4_;
        auVar21._12_4_ = fVar9 * auVar43._12_4_;
        auVar21._16_4_ = fVar9 * auVar43._16_4_;
        auVar21._20_4_ = fVar9 * auVar43._20_4_;
        auVar21._24_4_ = fVar9 * auVar43._24_4_;
        auVar21._28_4_ = auVar43._28_4_;
        auVar43 = vmaxps_avx(auVar18,auVar68);
        auVar89 = vmaxps_avx(auVar89,auVar43);
        auVar43 = vminps_avx(auVar21,auVar71);
        auVar43 = vminps_avx(auVar49,auVar43);
        auVar89 = vcmpps_avx(auVar89,auVar43,2);
LAB_004d6c10:
        uVar31 = vmovmskps_avx(auVar89);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar31);
        bVar26 = true;
      }
      else {
        if ((int)(sVar37 & 0xf) == 2) {
          uVar36 = sVar37 & 0xfffffffffffffff0;
          fVar44 = *(float *)(uVar36 + 0xbc);
          auVar80._0_4_ =
               fVar5 * *(float *)(uVar36 + 0xa0) + fVar6 * *(float *)(uVar36 + 0x100) +
               fVar4 * *(float *)(uVar36 + 0x40);
          auVar80._4_4_ =
               fVar5 * *(float *)(uVar36 + 0xa4) + fVar6 * *(float *)(uVar36 + 0x104) +
               fVar4 * *(float *)(uVar36 + 0x44);
          auVar80._8_4_ =
               fVar5 * *(float *)(uVar36 + 0xa8) + fVar6 * *(float *)(uVar36 + 0x108) +
               fVar4 * *(float *)(uVar36 + 0x48);
          auVar80._12_4_ =
               fVar5 * *(float *)(uVar36 + 0xac) + fVar6 * *(float *)(uVar36 + 0x10c) +
               fVar4 * *(float *)(uVar36 + 0x4c);
          auVar80._16_4_ =
               fVar5 * *(float *)(uVar36 + 0xb0) + fVar6 * *(float *)(uVar36 + 0x110) +
               fVar4 * *(float *)(uVar36 + 0x50);
          auVar80._20_4_ =
               fVar5 * *(float *)(uVar36 + 0xb4) + fVar6 * *(float *)(uVar36 + 0x114) +
               fVar4 * *(float *)(uVar36 + 0x54);
          auVar80._24_4_ =
               fVar5 * *(float *)(uVar36 + 0xb8) + fVar6 * *(float *)(uVar36 + 0x118) +
               fVar4 * *(float *)(uVar36 + 0x58);
          auVar80._28_4_ = in_ZMM10._28_4_ + fVar9 + fVar5;
          auVar88._0_4_ =
               fVar6 * *(float *)(uVar36 + 0x120) + fVar5 * *(float *)(uVar36 + 0xc0) +
               fVar4 * *(float *)(uVar36 + 0x60);
          auVar88._4_4_ =
               fVar6 * *(float *)(uVar36 + 0x124) + fVar5 * *(float *)(uVar36 + 0xc4) +
               fVar4 * *(float *)(uVar36 + 100);
          auVar88._8_4_ =
               fVar6 * *(float *)(uVar36 + 0x128) + fVar5 * *(float *)(uVar36 + 200) +
               fVar4 * *(float *)(uVar36 + 0x68);
          auVar88._12_4_ =
               fVar6 * *(float *)(uVar36 + 300) + fVar5 * *(float *)(uVar36 + 0xcc) +
               fVar4 * *(float *)(uVar36 + 0x6c);
          auVar88._16_4_ =
               fVar6 * *(float *)(uVar36 + 0x130) + fVar5 * *(float *)(uVar36 + 0xd0) +
               fVar4 * *(float *)(uVar36 + 0x70);
          auVar88._20_4_ =
               fVar6 * *(float *)(uVar36 + 0x134) + fVar5 * *(float *)(uVar36 + 0xd4) +
               fVar4 * *(float *)(uVar36 + 0x74);
          auVar88._24_4_ =
               fVar6 * *(float *)(uVar36 + 0x138) + fVar5 * *(float *)(uVar36 + 0xd8) +
               fVar4 * *(float *)(uVar36 + 0x78);
          auVar88._28_4_ = fVar10 + in_ZMM11._28_4_ + fVar5;
          auVar72._0_4_ =
               fVar6 * *(float *)(uVar36 + 0x140) + fVar5 * *(float *)(uVar36 + 0xe0) +
               fVar4 * *(float *)(uVar36 + 0x80);
          auVar72._4_4_ =
               fVar6 * *(float *)(uVar36 + 0x144) + fVar5 * *(float *)(uVar36 + 0xe4) +
               fVar4 * *(float *)(uVar36 + 0x84);
          auVar72._8_4_ =
               fVar6 * *(float *)(uVar36 + 0x148) + fVar5 * *(float *)(uVar36 + 0xe8) +
               fVar4 * *(float *)(uVar36 + 0x88);
          auVar72._12_4_ =
               fVar6 * *(float *)(uVar36 + 0x14c) + fVar5 * *(float *)(uVar36 + 0xec) +
               fVar4 * *(float *)(uVar36 + 0x8c);
          auVar72._16_4_ =
               fVar6 * *(float *)(uVar36 + 0x150) + fVar5 * *(float *)(uVar36 + 0xf0) +
               fVar4 * *(float *)(uVar36 + 0x90);
          auVar72._20_4_ =
               fVar6 * *(float *)(uVar36 + 0x154) + fVar5 * *(float *)(uVar36 + 0xf4) +
               fVar4 * *(float *)(uVar36 + 0x94);
          auVar72._24_4_ =
               fVar6 * *(float *)(uVar36 + 0x158) + fVar5 * *(float *)(uVar36 + 0xf8) +
               fVar4 * *(float *)(uVar36 + 0x98);
          auVar72._28_4_ = fVar11 + fVar5 + fVar5;
          auVar96._8_4_ = 0x7fffffff;
          auVar96._0_8_ = 0x7fffffff7fffffff;
          auVar96._12_4_ = 0x7fffffff;
          auVar96._16_4_ = 0x7fffffff;
          auVar96._20_4_ = 0x7fffffff;
          auVar96._24_4_ = 0x7fffffff;
          auVar96._28_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar80,auVar96);
          auVar41._8_4_ = 0x219392ef;
          auVar41._0_8_ = 0x219392ef219392ef;
          auVar41._12_4_ = 0x219392ef;
          auVar41._16_4_ = 0x219392ef;
          auVar41._20_4_ = 0x219392ef;
          auVar41._24_4_ = 0x219392ef;
          auVar41._28_4_ = 0x219392ef;
          auVar89 = vcmpps_avx(auVar89,auVar41,1);
          auVar43 = vblendvps_avx(auVar80,auVar41,auVar89);
          auVar89 = vandps_avx(auVar88,auVar96);
          auVar89 = vcmpps_avx(auVar89,auVar41,1);
          auVar49 = vblendvps_avx(auVar88,auVar41,auVar89);
          auVar89 = vandps_avx(auVar72,auVar96);
          auVar89 = vcmpps_avx(auVar89,auVar41,1);
          auVar89 = vblendvps_avx(auVar72,auVar41,auVar89);
          auVar41 = vrcpps_avx(auVar43);
          fVar70 = auVar41._0_4_;
          fVar73 = auVar41._4_4_;
          auVar14._4_4_ = fVar73 * auVar43._4_4_;
          auVar14._0_4_ = fVar70 * auVar43._0_4_;
          fVar74 = auVar41._8_4_;
          auVar14._8_4_ = fVar74 * auVar43._8_4_;
          fVar75 = auVar41._12_4_;
          auVar14._12_4_ = fVar75 * auVar43._12_4_;
          fVar76 = auVar41._16_4_;
          auVar14._16_4_ = fVar76 * auVar43._16_4_;
          fVar77 = auVar41._20_4_;
          auVar14._20_4_ = fVar77 * auVar43._20_4_;
          fVar78 = auVar41._24_4_;
          auVar14._24_4_ = fVar78 * auVar43._24_4_;
          auVar14._28_4_ = auVar43._28_4_;
          auVar42._8_4_ = 0x3f800000;
          auVar42._0_8_ = &DAT_3f8000003f800000;
          auVar42._12_4_ = 0x3f800000;
          auVar42._16_4_ = 0x3f800000;
          auVar42._20_4_ = 0x3f800000;
          auVar42._24_4_ = 0x3f800000;
          auVar42._28_4_ = 0x3f800000;
          auVar14 = vsubps_avx(auVar42,auVar14);
          auVar43 = vrcpps_avx(auVar49);
          fVar70 = fVar70 + fVar70 * auVar14._0_4_;
          fVar73 = fVar73 + fVar73 * auVar14._4_4_;
          fVar74 = fVar74 + fVar74 * auVar14._8_4_;
          fVar75 = fVar75 + fVar75 * auVar14._12_4_;
          fVar76 = fVar76 + fVar76 * auVar14._16_4_;
          fVar77 = fVar77 + fVar77 * auVar14._20_4_;
          fVar78 = fVar78 + fVar78 * auVar14._24_4_;
          fVar79 = auVar43._0_4_;
          fVar81 = auVar43._4_4_;
          auVar15._4_4_ = fVar81 * auVar49._4_4_;
          auVar15._0_4_ = fVar79 * auVar49._0_4_;
          fVar82 = auVar43._8_4_;
          auVar15._8_4_ = fVar82 * auVar49._8_4_;
          fVar83 = auVar43._12_4_;
          auVar15._12_4_ = fVar83 * auVar49._12_4_;
          fVar84 = auVar43._16_4_;
          auVar15._16_4_ = fVar84 * auVar49._16_4_;
          fVar85 = auVar43._20_4_;
          auVar15._20_4_ = fVar85 * auVar49._20_4_;
          fVar86 = auVar43._24_4_;
          auVar15._24_4_ = fVar86 * auVar49._24_4_;
          auVar15._28_4_ = auVar14._28_4_;
          auVar15 = vsubps_avx(auVar42,auVar15);
          auVar49 = vrcpps_avx(auVar89);
          fVar79 = fVar79 + fVar79 * auVar15._0_4_;
          fVar81 = fVar81 + fVar81 * auVar15._4_4_;
          fVar82 = fVar82 + fVar82 * auVar15._8_4_;
          fVar83 = fVar83 + fVar83 * auVar15._12_4_;
          fVar84 = fVar84 + fVar84 * auVar15._16_4_;
          fVar85 = fVar85 + fVar85 * auVar15._20_4_;
          fVar86 = fVar86 + fVar86 * auVar15._24_4_;
          fVar87 = auVar49._0_4_;
          fVar90 = auVar49._4_4_;
          auVar22._4_4_ = fVar90 * auVar89._4_4_;
          auVar22._0_4_ = fVar87 * auVar89._0_4_;
          fVar91 = auVar49._8_4_;
          auVar22._8_4_ = fVar91 * auVar89._8_4_;
          fVar92 = auVar49._12_4_;
          auVar22._12_4_ = fVar92 * auVar89._12_4_;
          fVar93 = auVar49._16_4_;
          auVar22._16_4_ = fVar93 * auVar89._16_4_;
          fVar94 = auVar49._20_4_;
          auVar22._20_4_ = fVar94 * auVar89._20_4_;
          fVar95 = auVar49._24_4_;
          auVar22._24_4_ = fVar95 * auVar89._24_4_;
          auVar22._28_4_ = auVar89._28_4_;
          auVar89 = vsubps_avx(auVar42,auVar22);
          fVar87 = fVar87 + fVar87 * auVar89._0_4_;
          fVar90 = fVar90 + fVar90 * auVar89._4_4_;
          fVar91 = fVar91 + fVar91 * auVar89._8_4_;
          fVar92 = fVar92 + fVar92 * auVar89._12_4_;
          fVar93 = fVar93 + fVar93 * auVar89._16_4_;
          fVar94 = fVar94 + fVar94 * auVar89._20_4_;
          fVar95 = fVar95 + fVar95 * auVar89._24_4_;
          fVar60 = *(float *)(uVar36 + 0x5c) +
                   fVar44 + *(float *)(uVar36 + 0x11c) + *(float *)(uVar36 + 0x17c);
          auVar55._0_4_ =
               -fVar70 * (fVar1 * *(float *)(uVar36 + 0x40) +
                         *(float *)(uVar36 + 0xa0) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x100) + *(float *)(uVar36 + 0x160));
          auVar55._4_4_ =
               -fVar73 * (fVar1 * *(float *)(uVar36 + 0x44) +
                         *(float *)(uVar36 + 0xa4) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x104) + *(float *)(uVar36 + 0x164));
          auVar55._8_4_ =
               -fVar74 * (fVar1 * *(float *)(uVar36 + 0x48) +
                         *(float *)(uVar36 + 0xa8) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x108) + *(float *)(uVar36 + 0x168));
          auVar55._12_4_ =
               -fVar75 * (fVar1 * *(float *)(uVar36 + 0x4c) +
                         *(float *)(uVar36 + 0xac) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x10c) + *(float *)(uVar36 + 0x16c));
          fVar57 = -fVar76 * (fVar1 * *(float *)(uVar36 + 0x50) +
                             *(float *)(uVar36 + 0xb0) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x110) + *(float *)(uVar36 + 0x170));
          auVar23._16_4_ = fVar57;
          auVar23._0_16_ = auVar55;
          fVar58 = -fVar77 * (fVar1 * *(float *)(uVar36 + 0x54) +
                             *(float *)(uVar36 + 0xb4) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x114) + *(float *)(uVar36 + 0x174));
          auVar23._20_4_ = fVar58;
          fVar59 = -fVar78 * (fVar1 * *(float *)(uVar36 + 0x58) +
                             *(float *)(uVar36 + 0xb8) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x118) + *(float *)(uVar36 + 0x178));
          auVar23._24_4_ = fVar59;
          auVar23._28_4_ = fVar60;
          fVar54 = *(float *)(uVar36 + 0x7c) +
                   fVar44 + *(float *)(uVar36 + 0x13c) + *(float *)(uVar36 + 0x19c);
          auVar48._0_4_ =
               -fVar79 * (fVar1 * *(float *)(uVar36 + 0x60) +
                         *(float *)(uVar36 + 0xc0) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x120) + *(float *)(uVar36 + 0x180));
          auVar48._4_4_ =
               -fVar81 * (fVar1 * *(float *)(uVar36 + 100) +
                         *(float *)(uVar36 + 0xc4) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x124) + *(float *)(uVar36 + 0x184));
          auVar48._8_4_ =
               -fVar82 * (fVar1 * *(float *)(uVar36 + 0x68) +
                         *(float *)(uVar36 + 200) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x128) + *(float *)(uVar36 + 0x188));
          auVar48._12_4_ =
               -fVar83 * (fVar1 * *(float *)(uVar36 + 0x6c) +
                         *(float *)(uVar36 + 0xcc) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 300) + *(float *)(uVar36 + 0x18c));
          fVar50 = -fVar84 * (fVar1 * *(float *)(uVar36 + 0x70) +
                             *(float *)(uVar36 + 0xd0) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x130) + *(float *)(uVar36 + 400));
          auVar24._16_4_ = fVar50;
          auVar24._0_16_ = auVar48;
          fVar52 = -fVar85 * (fVar1 * *(float *)(uVar36 + 0x74) +
                             *(float *)(uVar36 + 0xd4) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x134) + *(float *)(uVar36 + 0x194));
          auVar24._20_4_ = fVar52;
          fVar53 = -fVar86 * (fVar1 * *(float *)(uVar36 + 0x78) +
                             *(float *)(uVar36 + 0xd8) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x138) + *(float *)(uVar36 + 0x198));
          auVar24._24_4_ = fVar53;
          auVar24._28_4_ = fVar54;
          fVar47 = fVar44 + *(float *)(uVar36 + 0x15c) + *(float *)(uVar36 + 0x1bc) + -0.0;
          auVar40._0_4_ =
               -fVar87 * (fVar1 * *(float *)(uVar36 + 0x80) +
                         *(float *)(uVar36 + 0xe0) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x140) + *(float *)(uVar36 + 0x1a0));
          auVar40._4_4_ =
               -fVar90 * (fVar1 * *(float *)(uVar36 + 0x84) +
                         *(float *)(uVar36 + 0xe4) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x144) + *(float *)(uVar36 + 0x1a4));
          auVar40._8_4_ =
               -fVar91 * (fVar1 * *(float *)(uVar36 + 0x88) +
                         *(float *)(uVar36 + 0xe8) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x148) + *(float *)(uVar36 + 0x1a8));
          auVar40._12_4_ =
               -fVar92 * (fVar1 * *(float *)(uVar36 + 0x8c) +
                         *(float *)(uVar36 + 0xec) * fVar2 +
                         fVar3 * *(float *)(uVar36 + 0x14c) + *(float *)(uVar36 + 0x1ac));
          fVar44 = -fVar93 * (fVar1 * *(float *)(uVar36 + 0x90) +
                             *(float *)(uVar36 + 0xf0) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x150) + *(float *)(uVar36 + 0x1b0));
          auVar25._16_4_ = fVar44;
          auVar25._0_16_ = auVar40;
          fVar45 = -fVar94 * (fVar1 * *(float *)(uVar36 + 0x94) +
                             *(float *)(uVar36 + 0xf4) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x154) + *(float *)(uVar36 + 0x1b4));
          auVar25._20_4_ = fVar45;
          fVar46 = -fVar95 * (fVar1 * *(float *)(uVar36 + 0x98) +
                             *(float *)(uVar36 + 0xf8) * fVar2 +
                             fVar3 * *(float *)(uVar36 + 0x158) + *(float *)(uVar36 + 0x1b8));
          auVar25._24_4_ = fVar46;
          auVar25._28_4_ = fVar47;
          auVar63._0_4_ = fVar70 + auVar55._0_4_;
          auVar63._4_4_ = fVar73 + auVar55._4_4_;
          auVar63._8_4_ = fVar74 + auVar55._8_4_;
          auVar63._12_4_ = fVar75 + auVar55._12_4_;
          auVar65._16_4_ = fVar76 + fVar57;
          auVar65._0_16_ = auVar63;
          auVar65._20_4_ = fVar77 + fVar58;
          auVar65._24_4_ = fVar78 + fVar59;
          auVar65._28_4_ = auVar41._28_4_ + auVar14._28_4_ + fVar60;
          auVar66._0_4_ = fVar79 + auVar48._0_4_;
          auVar66._4_4_ = fVar81 + auVar48._4_4_;
          auVar66._8_4_ = fVar82 + auVar48._8_4_;
          auVar66._12_4_ = fVar83 + auVar48._12_4_;
          auVar67._16_4_ = fVar84 + fVar50;
          auVar67._0_16_ = auVar66;
          auVar67._20_4_ = fVar85 + fVar52;
          auVar67._24_4_ = fVar86 + fVar53;
          auVar67._28_4_ = auVar43._28_4_ + auVar15._28_4_ + fVar54;
          auVar61._0_4_ = fVar87 + auVar40._0_4_;
          auVar61._4_4_ = fVar90 + auVar40._4_4_;
          auVar61._8_4_ = fVar91 + auVar40._8_4_;
          auVar61._12_4_ = fVar92 + auVar40._12_4_;
          auVar62._16_4_ = fVar93 + fVar44;
          auVar62._0_16_ = auVar61;
          auVar62._20_4_ = fVar94 + fVar45;
          auVar62._24_4_ = fVar95 + fVar46;
          auVar62._28_4_ = auVar49._28_4_ + auVar89._28_4_ + fVar47;
          auVar12 = vpminsd_avx(auVar23._16_16_,auVar65._16_16_);
          auVar13 = vpminsd_avx(auVar55,auVar63);
          auVar69._16_16_ = auVar12;
          auVar69._0_16_ = auVar13;
          auVar51 = auVar24._16_16_;
          in_ZMM10 = ZEXT1664(auVar51);
          auVar12 = vpminsd_avx(auVar51,auVar67._16_16_);
          auVar13 = vpminsd_avx(auVar48,auVar66);
          auVar89._16_16_ = auVar12;
          auVar89._0_16_ = auVar13;
          auVar12 = vpminsd_avx(auVar25._16_16_,auVar62._16_16_);
          auVar13 = vpminsd_avx(auVar40,auVar61);
          auVar98._16_16_ = auVar12;
          auVar98._0_16_ = auVar13;
          auVar89 = vmaxps_avx(auVar89,auVar98);
          in_ZMM11 = ZEXT3264(auVar89);
          auVar12 = vpmaxsd_avx(auVar23._16_16_,auVar65._16_16_);
          auVar13 = vpmaxsd_avx(auVar55,auVar63);
          auVar56._16_16_ = auVar12;
          auVar56._0_16_ = auVar13;
          auVar12 = vpmaxsd_avx(auVar51,auVar67._16_16_);
          auVar13 = vpmaxsd_avx(auVar48,auVar66);
          auVar49._16_16_ = auVar12;
          auVar49._0_16_ = auVar13;
          auVar12 = vpmaxsd_avx(auVar25._16_16_,auVar62._16_16_);
          auVar13 = vpmaxsd_avx(auVar40,auVar61);
          auVar43._16_16_ = auVar12;
          auVar43._0_16_ = auVar13;
          auVar49 = vminps_avx(auVar49,auVar43);
          auVar43 = vmaxps_avx(auVar68,auVar69);
          auVar89 = vmaxps_avx(auVar43,auVar89);
          auVar43 = vminps_avx(auVar71,auVar56);
          auVar43 = vminps_avx(auVar43,auVar49);
          auVar89 = vcmpps_avx(auVar89,auVar43,2);
          goto LAB_004d6c10;
        }
        bVar26 = false;
      }
      if (bVar26) {
        if (unaff_RBX == 0) {
          uVar29 = 4;
        }
        else {
          uVar36 = sVar37 & 0xfffffffffffffff0;
          lVar30 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar29 = 0;
          sVar37 = *(size_t *)(uVar36 + lVar30 * 8);
          uVar33 = unaff_RBX - 1 & unaff_RBX;
          if (uVar33 != 0) {
            pNVar35->ptr = sVar37;
            lVar30 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar28 = uVar33 - 1;
            while( true ) {
              pNVar35 = pNVar35 + 1;
              sVar37 = *(size_t *)(uVar36 + lVar30 * 8);
              uVar28 = uVar28 & uVar33;
              if (uVar28 == 0) break;
              pNVar35->ptr = sVar37;
              lVar30 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              uVar33 = uVar28 - 1;
            }
          }
        }
      }
      else {
        uVar29 = 6;
      }
    } while (uVar29 == 0);
    if (uVar29 == 6) {
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
      cVar27 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar37 & 0xfffffffffffffff0) * 0x40 + 0x28))(pre,ray,k);
      uVar29 = 0;
      if (cVar27 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar29 = 1;
      }
    }
  } while ((uVar29 & 3) == 0);
  return pNVar34 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }